

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

RefCntAutoPtr<Diligent::ISwapChainGL> * __thiscall
Diligent::RefCntAutoPtr<Diligent::ISwapChainGL>::operator=
          (RefCntAutoPtr<Diligent::ISwapChainGL> *this,ISwapChainGL *pObj)

{
  ISwapChainGL *pIVar1;
  
  pIVar1 = this->m_pObject;
  if (pIVar1 != pObj) {
    if (pIVar1 != (ISwapChainGL *)0x0) {
      (**(code **)(*(long *)pIVar1 + 0x10))();
    }
    this->m_pObject = pObj;
    if (pObj != (ISwapChainGL *)0x0) {
      (**(code **)(*(long *)pObj + 8))(pObj);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }